

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ssize_t __thiscall Parser::write(Parser *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  qsizetype qVar2;
  const_iterator o;
  long in_FS_OFFSET;
  Point *point;
  QList<Point> *__range1_2;
  Function *func;
  QList<Function> *__range1_1;
  QString *m;
  QList<QString> *__range1;
  QString *prefix;
  QList<QString> *__range2;
  char16_t *str_1;
  char16_t *str;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator __end2;
  const_iterator __begin2;
  QTextStream out;
  Point *in_stack_fffffffffffffeb0;
  QIODevice *in_stack_fffffffffffffeb8;
  QTextStream *in_stack_fffffffffffffec0;
  QString *in_stack_fffffffffffffec8;
  QString *in_stack_fffffffffffffed0;
  char16_t *in_stack_ffffffffffffff08;
  const_iterator local_c0;
  Function *local_b8;
  const_iterator local_b0;
  const_iterator local_a8;
  QString *local_a0;
  const_iterator local_98;
  const_iterator local_90;
  QArrayDataPointer<char16_t> local_88 [2];
  QString *local_58;
  const_iterator local_50;
  const_iterator local_48;
  QArrayDataPointer<char16_t> local_40 [2];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  qVar2 = QList<QString>::size(&this->m_prefixes);
  if (0 < qVar2) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_40,(Data *)0x0,L"{\n",2);
    QString::QString(&in_stack_fffffffffffffeb0->name,(DataPointer *)this);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    QString::~QString((QString *)0x11198f);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffeb0);
    local_48.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_48 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffeb0);
    local_50.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_50 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffeb0);
    while( true ) {
      local_58 = local_50.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_48,local_50);
      if (!bVar1) break;
      QList<QString>::const_iterator::operator*(&local_48);
      QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      QTextStream::operator<<
                ((QTextStream *)in_stack_fffffffffffffec8,(char *)in_stack_ffffffffffffff08);
      QList<QString>::const_iterator::operator++(&local_48);
    }
    in_stack_ffffffffffffff08 = L"}\n";
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_88,(Data *)0x0,L"}\n",2);
    QString::QString(&in_stack_fffffffffffffeb0->name,(DataPointer *)this);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    QString::~QString((QString *)0x111aeb);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffeb0);
  }
  local_90.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_90 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffeb0);
  local_98.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_98 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffeb0);
  while( true ) {
    local_a0 = local_98.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_90,local_98);
    if (!bVar1) break;
    in_stack_fffffffffffffed0 = QList<QString>::const_iterator::operator*(&local_90);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    QTextStream::operator<<
              ((QTextStream *)in_stack_fffffffffffffec8,(char *)in_stack_ffffffffffffff08);
    QList<QString>::const_iterator::operator++(&local_90);
  }
  local_a8.i = (Function *)0xaaaaaaaaaaaaaaaa;
  local_a8 = QList<Function>::begin((QList<Function> *)in_stack_fffffffffffffeb0);
  local_b0.i = (Function *)0xaaaaaaaaaaaaaaaa;
  local_b0 = QList<Function>::end((QList<Function> *)in_stack_fffffffffffffeb0);
  while( true ) {
    local_b8 = local_b0.i;
    bVar1 = QList<Function>::const_iterator::operator!=(&local_a8,local_b0);
    if (!bVar1) break;
    QList<Function>::const_iterator::operator*(&local_a8);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,(QString *)this);
    QTextStream::operator<<((QTextStream *)this,(char *)in_stack_ffffffffffffff08);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,(QString *)this);
    QTextStream::operator<<((QTextStream *)this,(char *)in_stack_ffffffffffffff08);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,(QString *)this);
    QTextStream::operator<<((QTextStream *)this,(char *)in_stack_ffffffffffffff08);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,(QString *)this);
    QTextStream::operator<<((QTextStream *)this,(char *)in_stack_ffffffffffffff08);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,(QString *)this);
    QTextStream::operator<<((QTextStream *)this,(char *)in_stack_ffffffffffffff08);
    QList<Function>::const_iterator::operator++(&local_a8);
  }
  local_c0.i = (Point *)0xaaaaaaaaaaaaaaaa;
  local_c0 = QList<Point>::begin(in_stack_fffffffffffffeb0);
  o = QList<Point>::end(in_stack_fffffffffffffeb0);
  while( true ) {
    bVar1 = QList<Point>::const_iterator::operator!=(&local_c0,o);
    if (!bVar1) break;
    in_stack_fffffffffffffeb0 = QList<Point>::const_iterator::operator*(&local_c0);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,(QString *)this);
    QTextStream::operator<<((QTextStream *)this,(char *)in_stack_ffffffffffffff08);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffed0,(QString *)this);
    QTextStream::operator<<((QTextStream *)this,(char *)in_stack_ffffffffffffff08);
    QList<Point>::const_iterator::operator++(&local_c0);
  }
  QTextStream::~QTextStream((QTextStream *)in_stack_fffffffffffffeb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void Parser::write(QIODevice &input) const
{
    QTextStream out(&input);
    if (m_prefixes.size() > 0) {
        out << QStringLiteral("{\n");
        for (const auto &prefix : m_prefixes)
            out << prefix << "\n";
        out << QStringLiteral("}\n");
    }
    for (const auto &m : m_metadata)
        out << m << "\n";
    for (const auto &func : m_functions) {
        out << func.className << "_" << func.functionName << "_entry(" << func.functionParameters << ")\n";
        out << func.className << "_" << func.functionName << "_exit()\n";
    }
    for (const auto &point : m_points)
        out << point.name << "(" << point.parameters << ")\n";
}